

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O0

vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
* __thiscall
xmotion::
Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
::GetAllEdges(Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
              *this)

{
  bool bVar1;
  value_type *in_RSI;
  Vertex *in_RDI;
  edge_iterator it;
  Vertex *vertex;
  value_type *vertex_pair;
  const_iterator __end0;
  const_iterator __begin0;
  VertexMapType *__range2;
  vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
  *edges;
  Vertex *this_00;
  vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
  *in_stack_ffffffffffffffa0;
  _Self local_50;
  _Self local_48;
  Vertex *local_40;
  reference local_38;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  local_28;
  value_type *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::
  vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
  ::vector((vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
            *)0x104aae);
  local_20 = in_RSI + 1;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
       ::begin((unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
                *)in_RDI);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
       ::end((unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
              *)in_RDI);
  while (bVar1 = std::__detail::operator!=(&local_28,&local_30), bVar1) {
    local_38 = std::__detail::
               _Node_const_iterator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false,_false>
               ::operator*((_Node_const_iterator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false,_false>
                            *)0x104afc);
    local_40 = local_38->second;
    local_48._M_node = (_List_node_base *)Vertex::edge_begin(in_RDI);
    while( true ) {
      local_50._M_node = (_List_node_base *)Vertex::edge_end(in_RDI);
      bVar1 = std::operator!=(&local_48,&local_50);
      if (!bVar1) break;
      std::
      vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
      ::push_back(in_stack_ffffffffffffffa0,in_RSI);
      std::
      _List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>
      ::operator++(&local_48);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false,_false>
    ::operator++((_Node_const_iterator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false,_false>
                  *)this_00);
  }
  return (vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
          *)this_00;
}

Assistant:

std::vector<typename Graph<State, Transition, StateIndexer>::edge_iterator>
Graph<State, Transition, StateIndexer>::GetAllEdges() const {
  std::vector<typename Graph<State, Transition, StateIndexer>::edge_iterator>
      edges;
  for (auto &vertex_pair : vertex_map_) {
    auto vertex = vertex_pair.second;
    for (auto it = vertex->edge_begin(); it != vertex->edge_end(); ++it)
      edges.push_back(it);
  }
  return edges;
}